

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

NumericExpr __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprCounter>::
ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprCounter>
                *this,int opcode)

{
  int *piVar1;
  Kind KVar2;
  BinaryReader<mp::internal::EndiannessConverter> *pBVar3;
  char *pcVar4;
  CountExpr CVar5;
  int iVar6;
  NumericExpr NVar7;
  NumberOfArgHandler args;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_20;
  
  KVar2 = OpCodeInfo::INFO[opcode].first_kind;
  switch(KVar2) {
  case IF:
    ReadLogicalExpr(this);
    pBVar3 = this->reader_;
    pcVar4 = (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
    (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
    ReadNumericExpr(this,*pcVar4,false);
    goto LAB_0010b9a5;
  case PLTERM:
    iVar6 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
    if (iVar6 < 2) {
      local_38 = 0;
      uStack_30 = 0;
      local_20.types_ = 0;
      local_20.field_1.values_ = (Value *)&local_38;
      BinaryReaderBase::ReportError
                (&this->reader_->super_BinaryReaderBase,(CStringRef)0x139f3f,&local_20);
    }
    else {
      iVar6 = iVar6 + -1;
      do {
        pBVar3 = this->reader_;
        pcVar4 = (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
        (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
        (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
        ReadConstant(this,*pcVar4);
        pBVar3 = this->reader_;
        pcVar4 = (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
        (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
        (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
        ReadConstant(this,*pcVar4);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    pBVar3 = this->reader_;
    pcVar4 = (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
    (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
    ReadConstant(this,*pcVar4);
    ReadReference(this);
    break;
  case CALL:
  case LAST_VARARG:
switchD_0010b96d_caseD_29:
    local_38 = 0;
    uStack_30 = 0;
    local_20.types_ = 0;
    local_20.field_1.values_ = (Value *)&local_38;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x139f67,&local_20);
    break;
  case FIRST_ITERATED:
    iVar6 = ReadNumArgs(this,1);
    if (0 < iVar6) {
      do {
        pBVar3 = this->reader_;
        pcVar4 = (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
        (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
        (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
        ReadNumericExpr(this,*pcVar4,false);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    break;
  case SUM:
    iVar6 = ReadNumArgs(this,3);
    if (0 < iVar6) {
      do {
        pBVar3 = this->reader_;
        pcVar4 = (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
        (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
        (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
        ReadNumericExpr(this,*pcVar4,false);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    break;
  case LAST_ITERATED:
    iVar6 = ReadNumArgs(this,1);
    pBVar3 = this->reader_;
    pcVar4 = (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
    (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
    ReadNumericExpr(this,*pcVar4,false);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprCounter>::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprCounter>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<Expr>,Expr>::ArgHandler>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprCounter>
                *)this,iVar6 + -1,(ArgHandler *)&local_38);
    break;
  case NUMBEROF_SYM:
    iVar6 = ReadNumArgs(this,1);
    ReadSymbolicExpr(this);
    if (1 < iVar6) {
      iVar6 = iVar6 + -1;
      do {
        ReadSymbolicExpr(this);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    break;
  case COUNT:
    CVar5 = ReadCountExpr(this);
    return CVar5;
  default:
    if (KVar2 == ADD) {
      KVar2 = OpCodeInfo::INFO[opcode].kind;
      pBVar3 = this->reader_;
      pcVar4 = (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
      (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
      ReadNumericExpr(this,*pcVar4,false);
      pBVar3 = this->reader_;
      pcVar4 = (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
      (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
      NVar7 = ReadNumericExpr(this,*pcVar4,false);
      if (KVar2 != DIV) {
        return OTHER;
      }
      if (NVar7 == CONST) {
        return OTHER;
      }
      piVar1 = &this->handler_->num_divs;
      *piVar1 = *piVar1 + 1;
      return OTHER;
    }
    if (KVar2 != FIRST_UNARY) goto switchD_0010b96d_caseD_29;
LAB_0010b9a5:
    pBVar3 = this->reader_;
    pcVar4 = (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
    (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
    ReadNumericExpr(this,*pcVar4,false);
  }
  return OTHER;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}